

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qslider.cpp
# Opt level: O3

int __thiscall QSliderPrivate::init(QSliderPrivate *this,EVP_PKEY_CTX *ctx)

{
  QWidget *this_00;
  FocusPolicy policy;
  int extraout_EAX;
  QStyle *pQVar1;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 policy_00;
  
  this_00 = *(QWidget **)&(this->super_QAbstractSliderPrivate).super_QWidgetPrivate.field_0x8;
  this->pressedControl = SC_None;
  this->tickInterval = 0;
  this->tickPosition = NoTicks;
  this->hoverControl = SC_None;
  pQVar1 = QWidget::style(this_00);
  policy = (**(code **)(*(long *)pQVar1 + 0xf0))(pQVar1,0x31,0,this_00,0);
  QWidget::setFocusPolicy(this_00,policy);
  policy_00.data = 0xb070000;
  if ((this->super_QAbstractSliderPrivate).orientation == Vertical) {
    policy_00.data = 0xb700000;
  }
  QWidget::setSizePolicy(this_00,(QSizePolicy)policy_00);
  QWidget::setAttribute(this_00,WA_WState_OwnSizePolicy,false);
  resetLayoutItemMargins(this);
  return extraout_EAX;
}

Assistant:

void QSliderPrivate::init()
{
    Q_Q(QSlider);
    pressedControl = QStyle::SC_None;
    tickInterval = 0;
    tickPosition = QSlider::NoTicks;
    hoverControl = QStyle::SC_None;
    q->setFocusPolicy(Qt::FocusPolicy(q->style()->styleHint(QStyle::SH_Button_FocusPolicy, nullptr, q)));
    QSizePolicy sp(QSizePolicy::Expanding, QSizePolicy::Fixed, QSizePolicy::Slider);
    if (orientation == Qt::Vertical)
        sp.transpose();
    q->setSizePolicy(sp);
    q->setAttribute(Qt::WA_WState_OwnSizePolicy, false);
    resetLayoutItemMargins();
}